

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void av1_compute_stats_c(int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
                        int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,
                        int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  short sVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  int64_t *piVar7;
  byte *pbVar8;
  long lVar9;
  short *psVar10;
  int iVar11;
  uint8_t *puVar12;
  long lVar13;
  int64_t *piVar14;
  uint uVar15;
  undefined1 *puVar16;
  byte *pbVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int64_t *piVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  int32_t M_row [49];
  int32_t H_row [2401];
  short local_26f8 [56];
  int local_2688 [52];
  undefined1 local_25b8 [9608];
  
  uVar24 = wiener_win * wiener_win;
  if (v_start < v_end) {
    lVar5 = (long)v_start;
    puVar12 = dgd + dgd_stride * lVar5;
    uVar23 = 0;
    do {
      lVar21 = (long)h_start;
      if (h_start < h_end) {
        do {
          uVar23 = uVar23 + puVar12[lVar21];
          lVar21 = lVar21 + 1;
        } while (h_end != lVar21);
      }
      lVar5 = lVar5 + 1;
      puVar12 = puVar12 + dgd_stride;
    } while (lVar5 != v_end);
  }
  else {
    uVar23 = 0;
  }
  memset(local_2688,0,0xc4);
  memset(local_25b8,0,0x2584);
  uVar25 = (ulong)uVar24;
  memset(M,0,uVar25 * 8);
  memset(H,0,uVar25 * 8 * uVar25);
  if (v_end - v_start != 0 && v_start <= v_end) {
    iVar19 = wiener_win >> 1;
    bVar3 = (byte)(uVar23 / (ulong)(long)((v_end - v_start) * (h_end - h_start)));
    lVar5 = uVar25 * 4 + 4;
    iVar20 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    do {
      iVar11 = v_end - v_start;
      if (3 < v_end - v_start) {
        iVar11 = iVar20;
      }
      if (use_downsampled_wiener_stats == 0) {
        iVar11 = iVar20;
      }
      memset(local_2688,0,0xc4);
      memset(local_25b8,0,0x2584);
      if (h_start < h_end) {
        pbVar6 = dgd + ((long)v_start + (long)-iVar19) * (long)dgd_stride +
                       ((long)h_start - (long)iVar19);
        lVar21 = (long)h_start;
        do {
          if (-1 < iVar19) {
            lVar13 = 0;
            pbVar8 = pbVar6;
            lVar9 = (long)-iVar19;
            do {
              lVar13 = (long)(int)lVar13;
              pbVar17 = pbVar8;
              uVar15 = wiener_win | 1;
              do {
                local_26f8[lVar13] = (ushort)*pbVar17 - (ushort)bVar3;
                lVar13 = lVar13 + 1;
                pbVar17 = pbVar17 + dgd_stride;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
              lVar9 = lVar9 + 1;
              pbVar8 = pbVar8 + 1;
            } while (iVar19 + 1 != (int)lVar9);
          }
          if (wiener_win != 0) {
            bVar1 = src[lVar21 + v_start * src_stride];
            psVar10 = local_26f8;
            puVar16 = local_25b8;
            uVar18 = 0;
            uVar23 = uVar25;
            do {
              sVar2 = local_26f8[uVar18];
              local_2688[uVar18] = local_2688[uVar18] + ((uint)bVar1 - (uint)bVar3) * (int)sVar2;
              uVar4 = 0;
              do {
                *(int *)(puVar16 + uVar4 * 4) =
                     *(int *)(puVar16 + uVar4 * 4) + (int)psVar10[uVar4] * (int)sVar2;
                uVar4 = uVar4 + 1;
              } while (uVar23 != uVar4);
              uVar18 = uVar18 + 1;
              puVar16 = puVar16 + lVar5;
              uVar23 = uVar23 - 1;
              psVar10 = psVar10 + 1;
            } while (uVar18 != uVar25);
          }
          lVar21 = lVar21 + 1;
          pbVar6 = pbVar6 + 1;
        } while (lVar21 != h_end);
      }
      if (wiener_win != 0) {
        puVar16 = local_25b8;
        uVar23 = 0;
        piVar7 = H;
        do {
          M[uVar23] = M[uVar23] + (long)local_2688[uVar23] * (long)iVar11;
          lVar21 = 0;
          do {
            piVar7[lVar21] = piVar7[lVar21] + (long)*(int *)(puVar16 + lVar21 * 4) * (long)iVar11;
            lVar9 = uVar23 + lVar21;
            lVar21 = lVar21 + 1;
          } while (lVar9 + 1U < uVar25);
          uVar23 = uVar23 + 1;
          piVar7 = piVar7 + uVar25 + 1;
          puVar16 = puVar16 + lVar5;
        } while (uVar23 != uVar24 + (uVar24 == 0));
      }
      v_start = v_start + iVar11;
      iVar20 = iVar11;
    } while (v_start < v_end);
  }
  if (wiener_win != 0) {
    piVar7 = H + uVar25;
    piVar22 = H + 1;
    uVar18 = 0;
    uVar23 = uVar25;
    do {
      uVar23 = uVar23 - 1;
      uVar18 = uVar18 + 1;
      if (uVar18 < uVar25) {
        uVar4 = 0;
        piVar14 = piVar7;
        do {
          *piVar14 = piVar22[uVar4];
          uVar4 = uVar4 + 1;
          piVar14 = piVar14 + uVar25;
        } while (uVar23 != uVar4);
      }
      piVar22 = piVar22 + uVar25 + 1;
      piVar7 = piVar7 + uVar25 + 1;
    } while (uVar18 != uVar24 + (uVar24 == 0));
  }
  return;
}

Assistant:

void av1_compute_stats_c(int wiener_win, const uint8_t *dgd, const uint8_t *src,
                         int16_t *dgd_avg, int16_t *src_avg, int h_start,
                         int h_end, int v_start, int v_end, int dgd_stride,
                         int src_stride, int64_t *M, int64_t *H,
                         int use_downsampled_wiener_stats) {
  (void)dgd_avg;
  (void)src_avg;
  int i, k, l;
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  uint8_t avg = find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  int32_t M_row[WIENER_WIN2] = { 0 };
  int32_t H_row[WIENER_WIN2 * WIENER_WIN2] = { 0 };
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);

  for (i = v_start; i < v_end; i = i + downsample_factor) {
    if (use_downsampled_wiener_stats &&
        (v_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      downsample_factor = v_end - i;
    }

    memset(M_row, 0, sizeof(int32_t) * WIENER_WIN2);
    memset(H_row, 0, sizeof(int32_t) * WIENER_WIN2 * WIENER_WIN2);
    acc_stat_one_line(dgd, src + i * src_stride, dgd_stride, h_start, h_end,
                      avg, wiener_halfwin, wiener_win2, M_row, H_row, i);

    for (k = 0; k < wiener_win2; ++k) {
      // Scale M matrix based on the downsampling factor
      M[k] += ((int64_t)M_row[k] * downsample_factor);
      for (l = k; l < wiener_win2; ++l) {
        // H is a symmetric matrix, so we only need to fill out the upper
        // triangle here. We can copy it down to the lower triangle outside
        // the (i, j) loops.
        // Scale H Matrix based on the downsampling factor
        H[k * wiener_win2 + l] +=
            ((int64_t)H_row[k * wiener_win2 + l] * downsample_factor);
      }
    }
  }

  for (k = 0; k < wiener_win2; ++k) {
    for (l = k + 1; l < wiener_win2; ++l) {
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}